

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  ptls_aead_algorithm_t *aead;
  ptls_hash_algorithm_t *hash;
  size_t sVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  size_t sVar6;
  ptls_aead_context_t *ctx;
  ptls_aead_context_t *ctx_00;
  void *__s;
  byte *__ptr;
  uint8_t *puVar7;
  uint64_t uVar8;
  size_t sVar9;
  uint64_t uVar10;
  ulong uVar11;
  size_t i_2;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  size_t i;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  char cVar19;
  char cVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long local_2320;
  long local_2310;
  uint64_t local_22f8 [5];
  void *local_22d0;
  long local_22c8;
  char *local_22c0;
  char *local_22b8;
  ulong local_22b0;
  uint8_t secret [32];
  char HW [128];
  char OS [128];
  char local_2188 [138];
  utsname uts;
  uint8_t *v_enc [1000];
  
  iVar16 = 10000000;
  uVar4 = bench_time();
  uVar13 = 0xdeadbeef;
  uVar14 = 0;
  do {
    uVar12 = uVar13;
    uVar13 = (uVar12 << 0x1d | uVar12 >> 3) + uVar12 ^ uVar14;
    iVar16 = iVar16 + -1;
    uVar14 = uVar12;
  } while (iVar16 != 0);
  uVar5 = bench_time();
  OS[0] = '\0';
  HW[0] = '\0';
  iVar16 = uname((utsname *)&uts);
  if (iVar16 == 0) {
    sVar6 = strlen(uts.sysname);
    if (sVar6 + 1 < 0x80) {
      strcpy(OS,uts.sysname);
    }
    sVar6 = strlen(uts.machine);
    if (sVar6 + 1 < 0x80) {
      strcpy(HW,uts.machine);
    }
  }
  cVar20 = SBORROW4(argc,2);
  cVar19 = argc + -2 < 0;
  if (argc != 2) goto LAB_0010a940;
  pcVar2 = argv[1];
  cVar1 = *pcVar2;
  cVar20 = SBORROW1(cVar1,'-');
  cVar19 = (char)(cVar1 + -0x2d) < '\0';
  if (cVar1 == '-') {
    cVar1 = pcVar2[1];
    cVar20 = SBORROW1(cVar1,'f');
    cVar19 = (char)(cVar1 + -0x66) < '\0';
    if (cVar1 == 'f') {
      cVar20 = '\0';
      cVar19 = pcVar2[2] < '\0';
      if (pcVar2[2] == '\0') goto LAB_0010a942;
    }
  }
  do {
    main_cold_1();
LAB_0010a940:
  } while (cVar20 == cVar19);
LAB_0010a942:
  local_22c8 = CONCAT44(uVar12,uVar13);
  puts(
      "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,"
      );
  uVar18 = 0;
  lVar17 = 0;
  do {
    if ((argc == 2) || (aead_list[uVar18].enabled_by_defaut != 0)) {
      local_22b8 = aead_list[uVar18].provider;
      local_22c0 = aead_list[uVar18].algo_name;
      aead = aead_list[uVar18].aead;
      hash = aead_list[uVar18].hash;
      local_2188[0] = '\0';
      local_22b0 = uVar18;
      iVar16 = strcmp(local_22b8,"openssl");
      if (iVar16 == 0) {
        sprintf(local_2188,"%d.%d.%d%c",3,0,0,0x62);
      }
      builtin_memcpy(secret + 0x10,"zzzzzzzzzzzzzzzz",0x10);
      builtin_memcpy(secret,"zzzzzzzzzzzzzzzz",0x10);
      ctx = ptls_aead_new(aead,hash,1,secret,(char *)0x0);
      ctx_00 = ptls_aead_new(aead,hash,0,secret,(char *)0x0);
      if (ctx_00 == (ptls_aead_context_t *)0x0 || ctx == (ptls_aead_context_t *)0x0) {
        lVar17 = lVar17 + local_22c8;
        iVar16 = 0x201;
      }
      else {
        memset(v_enc,0,8000);
        local_22f8[0] = 0;
        local_22f8[1] = 0;
        local_22f8[2] = 0;
        local_22f8[3] = 0;
        __s = malloc(0x5dc);
        __ptr = (byte *)malloc(0x5dc);
        iVar16 = 0x201;
        if (__ptr == (byte *)0x0 || __s == (void *)0x0) {
LAB_0010abf3:
          lVar17 = 0;
          local_2320 = 0;
          local_2310 = 0;
        }
        else {
          uVar18 = 0;
          do {
            puVar7 = (uint8_t *)malloc(0x61c);
            v_enc[uVar18] = puVar7;
            if (0x3e6 < uVar18) break;
            uVar18 = uVar18 + 1;
          } while (puVar7 != (uint8_t *)0x0);
          if (puVar7 == (uint8_t *)0x0) goto LAB_0010abf3;
          memset(__s,0,0x5dc);
          local_22f8[4] = bench_time();
          lVar17 = 0;
          lVar15 = 0;
          do {
            local_22f8[0] = local_22f8[0] + 1;
            puVar7 = v_enc[lVar15];
            (*ctx->do_encrypt)(ctx,puVar7,__s,0x5dc,local_22f8[0],local_22f8,0x20,
                               (ptls_aead_supplementary_encryption_t *)0x0);
            lVar17 = lVar17 + (ulong)puVar7[0x5dc];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 1000);
          sVar3 = ctx->algo->tag_size;
          local_22d0 = __s;
          uVar8 = bench_time();
          local_22f8[0] = 0;
          lVar15 = 0;
          do {
            local_22f8[0] = local_22f8[0] + 1;
            sVar9 = (*ctx_00->do_decrypt)
                              (ctx_00,__ptr,v_enc[lVar15],sVar3 + 0x5dc,local_22f8[0],local_22f8,
                               0x20);
            if (sVar9 != 0x5dc) {
              iVar16 = 0x33;
              goto LAB_0010ac10;
            }
            lVar17 = lVar17 + (ulong)*__ptr;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 1000);
          iVar16 = 0;
LAB_0010ac10:
          uVar10 = bench_time();
          local_2310 = uVar10 - uVar8;
          local_2320 = uVar8 - local_22f8[4];
          __s = local_22d0;
        }
        if (__s != (void *)0x0) {
          free(__s);
        }
        lVar15 = 0;
        do {
          if (v_enc[lVar15] != (uint8_t *)0x0) {
            free(v_enc[lVar15]);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 1000);
        if (__ptr != (byte *)0x0) {
          free(__ptr);
        }
        if (iVar16 == 0) {
          auVar21._8_4_ = (int)((ulong)local_2320 >> 0x20);
          auVar21._0_8_ = local_2320;
          auVar21._12_4_ = 0x45300000;
          auVar22._8_4_ = (int)((ulong)local_2310 >> 0x20);
          auVar22._0_8_ = local_2310;
          auVar22._12_4_ = 0x45300000;
          printf("%s, %s, %d, %s, %d, %s, %s, %s, %d, %d, %d, %d, %.2f, %.2f\n",
                 12000000.0 /
                 ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2320) - 4503599627370496.0)),
                 12000000.0 /
                 ((auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2310) - 4503599627370496.0)),OS,HW,0x40,
                 "release",(ulong)(uint)((int)uVar5 - (int)uVar4),local_22b8,local_2188,local_22c0,
                 1000,0x5dc,local_2320,local_2310);
          iVar16 = 0;
        }
      }
      if (ctx != (ptls_aead_context_t *)0x0) {
        ptls_aead_free(ctx);
      }
      uVar11 = local_22b0;
      if (ctx_00 != (ptls_aead_context_t *)0x0) {
        ptls_aead_free(ctx_00);
        uVar11 = local_22b0;
      }
    }
    else {
      iVar16 = 0;
      uVar11 = uVar18;
    }
    if ((iVar16 != 0) || (uVar18 = uVar11 + 1, 6 < uVar11)) {
      if (lVar17 == 0) {
        printf("Unexpected value of test sum s = %llx\n",0);
      }
      return iVar16;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;
    int force_all_tests = 0;
    uint64_t x = 0xdeadbeef;
    uint64_t s = 0;
    int basic_ref = bench_basic(&x);
    char OS[128];
    char HW[128];
#ifndef _WINDOWS
    struct utsname uts;
#endif

#ifdef _WINDOWS
    (void)strcpy_s(OS, sizeof(OS), "windows");
    (void)strcpy_s(HW, sizeof(HW), "x86_64");
#else
    OS[0] = 0;
    HW[0] = 0;
    if (uname(&uts) == 0) {
        if (strlen(uts.sysname) + 1 < sizeof(OS)) {
            strcpy(OS, uts.sysname);
        }
        if (strlen(uts.machine) + 1 < sizeof(HW)) {
            strcpy(HW, uts.machine);
        }
    }
#endif

#ifdef PTLS_HAVE_MBEDTLS
    if (psa_crypto_init() != PSA_SUCCESS) {
        fprintf(stderr, "psa_crypto_init fails.\n");
        exit(-1);
    }
#endif

    if (argc == 2 && strcmp(argv[1], "-f") == 0) {
        force_all_tests = 1;
    } else if (argc > 1) {
        fprintf(stderr, "Usage: %s [-f]\n   Use option \"-f\" to force execution of the slower tests.\n", argv[0]);
        exit(-1);
    }

    printf(
        "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,\n");

    for (size_t i = 0; ret == 0 && i < nb_aead_list; i++) {
        if (aead_list[i].enabled_by_defaut || force_all_tests) {
            ret = bench_run_aead(OS, HW, basic_ref, x, aead_list[i].provider, aead_list[i].algo_name, aead_list[i].aead,
                                 aead_list[i].hash, 1000, 1500, &s);
        }
    }

    /* Gratuitous test, designed to ensure that the initial computation
     * of the basic reference benchmark is not optimized away. */
    if (s == 0) {
        printf("Unexpected value of test sum s = %llx\n", (unsigned long long)s);
    }

#ifdef PTLS_HAVE_MBEDTLS
    /* Deinitialize the PSA crypto library. */
    mbedtls_psa_crypto_free();
#endif

    return ret;
}